

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_mpi.c
# Opt level: O0

int Env_nproc_y(Env *env)

{
  Bool_t BVar1;
  int result;
  Env *env_local;
  
  BVar1 = Env_mpi_are_values_set_(env);
  if (BVar1 != 0) {
    return 1;
  }
  __assert_fail("Env_mpi_are_values_set_( env )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/env_mpi.c"
                ,0xad,"int Env_nproc_y(const Env *)");
}

Assistant:

int Env_nproc_y( const Env* env )
{
  Assert( Env_mpi_are_values_set_( env ) );
  int result = 1;
#ifdef USE_MPI
  result = env->nproc_y_;
#endif
  Assert( result > 0 );
  return result;
}